

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPersistentManifold.h
# Opt level: O3

void __thiscall
cbtPersistentManifold::replaceContactPoint
          (cbtPersistentManifold *this,cbtManifoldPoint *newPoint,int insertIndex)

{
  cbtManifoldPoint *pcVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  void *pvVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  int iVar30;
  int iVar31;
  undefined4 uVar32;
  int iVar33;
  cbtScalar cVar34;
  cbtScalar cVar35;
  cbtScalar cVar36;
  cbtScalar cVar37;
  cbtScalar cVar38;
  anon_union_4_2_6ad150e0_for_cbtManifoldPoint_22 aVar39;
  anon_union_4_2_42dea85c_for_cbtManifoldPoint_24 aVar40;
  cbtScalar cVar41;
  int iVar42;
  cbtScalar cVar43;
  cbtScalar cVar44;
  cbtScalar cVar45;
  cbtScalar cVar46;
  anon_union_4_2_6ad150e0_for_cbtManifoldPoint_22 aVar47;
  anon_union_4_2_42dea85c_for_cbtManifoldPoint_24 aVar48;
  cbtScalar cVar49;
  int iVar50;
  cbtScalar cVar51;
  cbtScalar cVar52;
  cbtScalar cVar53;
  cbtScalar cVar54;
  cbtScalar cVar55;
  int iVar56;
  undefined1 auVar57 [16];
  
  pcVar1 = this->m_pointCache + insertIndex;
  uVar3 = pcVar1->m_appliedImpulse;
  uVar6 = pcVar1->m_appliedImpulseLateral1;
  auVar57._4_4_ = uVar6;
  auVar57._0_4_ = uVar3;
  auVar57._8_8_ = 0;
  fVar2 = pcVar1->m_appliedImpulseLateral2;
  iVar7 = pcVar1->m_lifeTime;
  if ((newPoint->m_contactPointFlags & 0x10) != 0) {
    auVar9 = vmovshdup_avx(auVar57);
    auVar9 = vfmadd213ss_fma(auVar9,auVar9,ZEXT416((uint)(fVar2 * fVar2)));
    auVar10 = vfmadd231ss_fma(ZEXT816(0),auVar57,ZEXT416((uint)pcVar1->m_combinedFriction));
    if (auVar9._0_4_ <= auVar10._0_4_ * auVar10._0_4_) goto LAB_008bb4cb;
  }
  uVar11 = *(undefined8 *)pcVar1->reactions_cache;
  uVar12 = *(undefined8 *)(pcVar1->reactions_cache + 2);
  uVar4 = *(undefined8 *)(pcVar1->reactions_cache + 4);
  uVar5 = *(undefined8 *)newPoint->reactions_cache;
  uVar13 = *(undefined8 *)(newPoint->reactions_cache + 2);
  uVar14 = *(undefined8 *)(newPoint->reactions_cache + 4);
  uVar15 = *(undefined8 *)(newPoint->m_localPointA).m_floats;
  uVar16 = *(undefined8 *)((newPoint->m_localPointA).m_floats + 2);
  uVar17 = *(undefined8 *)(newPoint->m_localPointB).m_floats;
  uVar18 = *(undefined8 *)((newPoint->m_localPointB).m_floats + 2);
  uVar19 = *(undefined8 *)(newPoint->m_positionWorldOnB).m_floats;
  uVar20 = *(undefined8 *)((newPoint->m_positionWorldOnB).m_floats + 2);
  uVar21 = *(undefined8 *)(newPoint->m_positionWorldOnA).m_floats;
  uVar22 = *(undefined8 *)((newPoint->m_positionWorldOnA).m_floats + 2);
  uVar23 = *(undefined8 *)(newPoint->m_normalWorldOnB).m_floats;
  uVar24 = *(undefined8 *)((newPoint->m_normalWorldOnB).m_floats + 2);
  cVar51 = newPoint->m_distance1;
  cVar52 = newPoint->m_combinedFriction;
  cVar53 = newPoint->m_combinedRollingFriction;
  cVar54 = newPoint->m_combinedSpinningFriction;
  cVar55 = newPoint->m_combinedRestitution;
  iVar56 = newPoint->m_partId0;
  iVar30 = newPoint->m_index0;
  iVar31 = newPoint->m_index1;
  uVar32 = *(undefined4 *)&newPoint->field_0x8c;
  pvVar25 = newPoint->m_userPersistentData;
  iVar33 = newPoint->m_contactPointFlags;
  cVar34 = newPoint->m_appliedImpulse;
  cVar35 = newPoint->m_appliedImpulseLateral1;
  cVar36 = newPoint->m_appliedImpulseLateral2;
  cVar37 = newPoint->m_contactMotion1;
  cVar38 = newPoint->m_contactMotion2;
  aVar39 = newPoint->field_22;
  aVar40 = newPoint->field_23;
  cVar41 = newPoint->m_frictionCFM;
  iVar42 = newPoint->m_lifeTime;
  cVar43 = newPoint->m_appliedImpulseLateral1;
  cVar44 = newPoint->m_appliedImpulseLateral2;
  cVar45 = newPoint->m_contactMotion1;
  cVar46 = newPoint->m_contactMotion2;
  aVar47 = newPoint->field_22;
  aVar48 = newPoint->field_23;
  cVar49 = newPoint->m_frictionCFM;
  iVar50 = newPoint->m_lifeTime;
  uVar26 = *(undefined8 *)(newPoint->m_lateralFrictionDir1).m_floats;
  uVar27 = *(undefined8 *)((newPoint->m_lateralFrictionDir1).m_floats + 2);
  uVar28 = *(undefined8 *)(newPoint->m_lateralFrictionDir2).m_floats;
  uVar29 = *(undefined8 *)((newPoint->m_lateralFrictionDir2).m_floats + 2);
  pvVar8 = pcVar1->m_userPersistentData;
  pcVar1->m_partId1 = newPoint->m_partId1;
  pcVar1->m_index0 = iVar30;
  pcVar1->m_index1 = iVar31;
  *(undefined4 *)&pcVar1->field_0x8c = uVar32;
  pcVar1->m_userPersistentData = pvVar25;
  pcVar1->m_contactPointFlags = iVar33;
  pcVar1->m_appliedImpulse = cVar34;
  pcVar1->m_appliedImpulseLateral1 = cVar35;
  pcVar1->m_appliedImpulseLateral2 = cVar36;
  pcVar1->m_contactMotion1 = cVar37;
  pcVar1->m_contactMotion2 = cVar38;
  pcVar1->field_22 = aVar39;
  pcVar1->field_23 = aVar40;
  pcVar1->m_frictionCFM = cVar41;
  pcVar1->m_lifeTime = iVar42;
  pcVar1->m_appliedImpulseLateral1 = cVar43;
  pcVar1->m_appliedImpulseLateral2 = cVar44;
  pcVar1->m_contactMotion1 = cVar45;
  pcVar1->m_contactMotion2 = cVar46;
  pcVar1->field_22 = aVar47;
  pcVar1->field_23 = aVar48;
  pcVar1->m_frictionCFM = cVar49;
  pcVar1->m_lifeTime = iVar50;
  *(undefined8 *)(pcVar1->m_lateralFrictionDir1).m_floats = uVar26;
  *(undefined8 *)((pcVar1->m_lateralFrictionDir1).m_floats + 2) = uVar27;
  *(undefined8 *)(pcVar1->m_lateralFrictionDir2).m_floats = uVar28;
  *(undefined8 *)((pcVar1->m_lateralFrictionDir2).m_floats + 2) = uVar29;
  *(undefined8 *)pcVar1->reactions_cache = uVar5;
  *(undefined8 *)(pcVar1->reactions_cache + 2) = uVar13;
  *(undefined8 *)(pcVar1->reactions_cache + 4) = uVar14;
  *(undefined8 *)(pcVar1->m_localPointA).m_floats = uVar15;
  *(undefined8 *)((pcVar1->m_localPointA).m_floats + 2) = uVar16;
  *(undefined8 *)(pcVar1->m_localPointB).m_floats = uVar17;
  *(undefined8 *)((pcVar1->m_localPointB).m_floats + 2) = uVar18;
  *(undefined8 *)(pcVar1->m_positionWorldOnB).m_floats = uVar19;
  *(undefined8 *)((pcVar1->m_positionWorldOnB).m_floats + 2) = uVar20;
  *(undefined8 *)(pcVar1->m_positionWorldOnA).m_floats = uVar21;
  *(undefined8 *)((pcVar1->m_positionWorldOnA).m_floats + 2) = uVar22;
  *(undefined8 *)(pcVar1->m_normalWorldOnB).m_floats = uVar23;
  *(undefined8 *)((pcVar1->m_normalWorldOnB).m_floats + 2) = uVar24;
  pcVar1->m_distance1 = cVar51;
  pcVar1->m_combinedFriction = cVar52;
  pcVar1->m_combinedRollingFriction = cVar53;
  pcVar1->m_combinedSpinningFriction = cVar54;
  pcVar1->m_combinedRestitution = cVar55;
  pcVar1->m_partId0 = iVar56;
  pcVar1->m_userPersistentData = pvVar8;
  uVar5 = vmovlps_avx(auVar57);
  pcVar1->m_appliedImpulse = (cbtScalar)(int)uVar5;
  pcVar1->m_appliedImpulseLateral1 = (cbtScalar)(int)((ulong)uVar5 >> 0x20);
  pcVar1->m_appliedImpulseLateral2 = fVar2;
  *(undefined8 *)pcVar1->reactions_cache = uVar11;
  *(undefined8 *)(pcVar1->reactions_cache + 2) = uVar12;
  *(undefined8 *)(pcVar1->reactions_cache + 4) = uVar4;
LAB_008bb4cb:
  pcVar1->m_lifeTime = iVar7;
  return;
}

Assistant:

void replaceContactPoint(const cbtManifoldPoint& newPoint, int insertIndex)
	{
		cbtAssert(validContactDistance(newPoint));

#define MAINTAIN_PERSISTENCY 1
#ifdef MAINTAIN_PERSISTENCY
		int lifeTime = m_pointCache[insertIndex].getLifeTime();
		cbtScalar appliedImpulse = m_pointCache[insertIndex].m_appliedImpulse;
		cbtScalar appliedLateralImpulse1 = m_pointCache[insertIndex].m_appliedImpulseLateral1;
		cbtScalar appliedLateralImpulse2 = m_pointCache[insertIndex].m_appliedImpulseLateral2;

		bool replacePoint = true;
		///we keep existing contact points for friction anchors
		///if the friction force is within the Coulomb friction cone
		if (newPoint.m_contactPointFlags & BT_CONTACT_FLAG_FRICTION_ANCHOR)
		{
			//   printf("appliedImpulse=%f\n", appliedImpulse);
			//   printf("appliedLateralImpulse1=%f\n", appliedLateralImpulse1);
			//   printf("appliedLateralImpulse2=%f\n", appliedLateralImpulse2);
			//   printf("mu = %f\n", m_pointCache[insertIndex].m_combinedFriction);
			cbtScalar mu = m_pointCache[insertIndex].m_combinedFriction;
			cbtScalar eps = 0;  //we could allow to enlarge or shrink the tolerance to check against the friction cone a bit, say 1e-7
			cbtScalar a = appliedLateralImpulse1 * appliedLateralImpulse1 + appliedLateralImpulse2 * appliedLateralImpulse2;
			cbtScalar b = eps + mu * appliedImpulse;
			b = b * b;
			replacePoint = (a) > (b);
		}

		if (replacePoint)
		{
			cbtAssert(lifeTime >= 0);
			void* cache = m_pointCache[insertIndex].m_userPersistentData;

			float mx = m_pointCache[insertIndex].reactions_cache[0]; // ***CHRONO***
			float my = m_pointCache[insertIndex].reactions_cache[1];
			float mz = m_pointCache[insertIndex].reactions_cache[2];
			float mf = m_pointCache[insertIndex].reactions_cache[3];
			float mg = m_pointCache[insertIndex].reactions_cache[4];
			float mh = m_pointCache[insertIndex].reactions_cache[5];

			m_pointCache[insertIndex] = newPoint;
			m_pointCache[insertIndex].m_userPersistentData = cache;
			m_pointCache[insertIndex].m_appliedImpulse = appliedImpulse;
			m_pointCache[insertIndex].m_appliedImpulseLateral1 = appliedLateralImpulse1;
			m_pointCache[insertIndex].m_appliedImpulseLateral2 = appliedLateralImpulse2;

			m_pointCache[insertIndex].reactions_cache[0] = mx;  // ***CHRONO***
			m_pointCache[insertIndex].reactions_cache[1] = my;
			m_pointCache[insertIndex].reactions_cache[2] = mz;
			m_pointCache[insertIndex].reactions_cache[3] = mf;
			m_pointCache[insertIndex].reactions_cache[4] = mg;
			m_pointCache[insertIndex].reactions_cache[5] = mh;
		}

		m_pointCache[insertIndex].m_lifeTime = lifeTime;
#else
		clearUserCache(m_pointCache[insertIndex]);
		m_pointCache[insertIndex] = newPoint;

#endif
	}